

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_parse_hex(char *p,int length)

{
  int iVar1;
  int len;
  int i;
  int length_local;
  char *p_local;
  
  i = 0;
  for (len = 0; len < length; len = len + 1) {
    if ((p[len] < 'a') || ('f' < p[len])) {
      if ((p[len] < 'A') || ('F' < p[len])) {
        iVar1 = p[len] + -0x30;
      }
      else {
        iVar1 = p[len] + -0x37;
      }
    }
    else {
      iVar1 = p[len] + -0x57;
    }
    i = iVar1 + i * 0x10;
  }
  return i;
}

Assistant:

NK_INTERN int
nk_parse_hex(const char *p, int length)
{
int i = 0;
int len = 0;
while (len < length) {
i <<= 4;
if (p[len] >= 'a' && p[len] <= 'f')
i += ((p[len] - 'a') + 10);
else if (p[len] >= 'A' && p[len] <= 'F')
i += ((p[len] - 'A') + 10);
else i += (p[len] - '0');
len++;
}
return i;
}